

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsidebar.cpp
# Opt level: O0

void __thiscall QSidebar::showContextMenu(QSidebar *this,QPoint *position)

{
  bool bVar1;
  QWidget *this_00;
  qsizetype qVar2;
  undefined8 in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QAction *action;
  QList<QAction_*> actions;
  undefined4 uVar3;
  ComponentFormattingOption in_stack_fffffffffffffeec;
  QWidget *in_stack_fffffffffffffef0;
  undefined7 in_stack_fffffffffffffef8;
  byte in_stack_fffffffffffffeff;
  code *in_stack_ffffffffffffff08;
  offset_in_QSidebar_to_subr *in_stack_ffffffffffffff30;
  Connection local_b8 [2];
  undefined1 local_a8 [8];
  offset_in_QAction_to_subr in_stack_ffffffffffffff60;
  QUrl local_90;
  undefined1 local_88 [8];
  ConnectionType in_stack_ffffffffffffff80;
  undefined1 local_70 [24];
  undefined1 local_58 [24];
  QList<QAction_*> local_40;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_40.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_40.d.ptr = (QAction **)&DAT_aaaaaaaaaaaaaaaa;
  local_40.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QAction_*>::QList((QList<QAction_*> *)0x786b6a);
  (**(code **)(*(long *)in_RDI + 0x1f0))(local_58,in_RDI,in_RSI);
  bVar1 = QModelIndex::isValid((QModelIndex *)in_stack_fffffffffffffef0);
  if (bVar1) {
    this_00 = (QWidget *)operator_new(0x10);
    QFileDialog::tr((char *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8),
                    (char *)this_00,in_stack_fffffffffffffeec);
    QAction::QAction((QAction *)this_00,(QString *)local_70,&in_RDI->super_QObject);
    QString::~QString((QString *)0x786beb);
    in_stack_fffffffffffffef0 = this_00;
    (**(code **)(*(long *)in_RDI + 0x1f0))(local_a8,in_RDI,in_RSI);
    QModelIndex::data((QModelIndex *)in_stack_ffffffffffffff08,(int)((ulong)in_RDI >> 0x20));
    ::QVariant::toUrl();
    QFlags<QUrl::ComponentFormattingOption>::QFlags
              ((QFlags<QUrl::ComponentFormattingOption> *)in_stack_fffffffffffffef0,
               in_stack_fffffffffffffeec);
    QUrl::path((QFlags_conflict1 *)local_88);
    in_stack_fffffffffffffeff = QString::isEmpty((QString *)0x786c6e);
    QString::~QString((QString *)0x786c7f);
    QUrl::~QUrl(&local_90);
    ::QVariant::~QVariant(&local_28);
    if ((in_stack_fffffffffffffeff & 1) != 0) {
      QAction::setEnabled(SUB81(this_00,0));
    }
    in_stack_ffffffffffffff08 = QAction::triggered;
    uVar3 = 0;
    QObject::connect<void(QAction::*)(bool),void(QSidebar::*)()>
              ((Object *)0x0,in_stack_ffffffffffffff60,(ContextType *)removeEntry,
               in_stack_ffffffffffffff30,in_stack_ffffffffffffff80);
    QMetaObject::Connection::~Connection(local_b8);
    QList<QAction_*>::append
              ((QList<QAction_*> *)0x786d21,
               (parameter_type)CONCAT44(in_stack_fffffffffffffeec,uVar3));
  }
  qVar2 = QList<QAction_*>::size(&local_40);
  if (0 < qVar2) {
    QWidget::mapToGlobal
              (in_RDI,(QPoint *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
    QMenu::exec((QList<QAction_*> *)in_stack_ffffffffffffff08,(QPoint *)in_RDI,
                (QAction *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8),
                in_stack_fffffffffffffef0);
  }
  QList<QAction_*>::~QList((QList<QAction_*> *)0x786d6e);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSidebar::showContextMenu(const QPoint &position)
{
    QList<QAction *> actions;
    if (indexAt(position).isValid()) {
        QAction *action = new QAction(QFileDialog::tr("Remove"), this);
        if (indexAt(position).data(QUrlModel::UrlRole).toUrl().path().isEmpty())
            action->setEnabled(false);
        connect(action, &QAction::triggered, this, &QSidebar::removeEntry);
        actions.append(action);
    }
    if (actions.size() > 0)
        QMenu::exec(actions, mapToGlobal(position));
}